

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionSkipBytes.cpp
# Opt level: O3

void __thiscall
Hpipe::InstructionSkipBytes::write_cpp
          (InstructionSkipBytes *this,StreamSepMaker *ss,StreamSepMaker *es,CppEmitter *cpp_emitter)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  const_iterator cVar5;
  ostream *poVar6;
  ostream *poVar7;
  StreamSep *pSVar8;
  long *plVar9;
  ulong *puVar10;
  size_type *psVar11;
  StreamSep *__return_storage_ptr__;
  StreamSep *this_00;
  uint cont_label;
  string v;
  undefined1 local_6e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6d8 [3];
  uint local_69c;
  string local_698;
  key_type local_678;
  string local_658;
  string local_638;
  StreamSep local_618;
  StreamSep local_5d0;
  StreamSep local_588;
  StreamSep local_540;
  StreamSep local_4f8;
  StreamSep local_4b0;
  StreamSep local_468;
  StreamSep local_420;
  StreamSep local_3d8;
  StreamSep local_390;
  StreamSep local_348;
  StreamSep local_300;
  StreamSep local_2b8;
  StreamSep local_270;
  StreamSep local_228;
  StreamSep local_1e0;
  StreamSep local_198;
  StreamSep local_150;
  StreamSep local_108;
  StreamSep local_c0;
  StreamSep local_78;
  
  __return_storage_ptr__ = (StreamSep *)local_6e8;
  pSVar8 = (StreamSep *)local_6e8;
  this_00 = (StreamSep *)local_6e8;
  bVar2 = CppEmitter::need_buf(cpp_emitter);
  if (!bVar2) {
    if (cpp_emitter->buffer_type == 3) {
      if (this->beg == true) {
        StreamSepMaker::operator<<((StreamSep *)local_6e8,ss,(char (*) [6])"if ( ");
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_6e8._0_8_,(char *)local_6e8._8_8_,
                            local_6d8[0]._M_allocated_capacity);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,(this->var)._M_dataplus._M_p,(this->var)._M_string_length);
        StreamSep::operator<<((StreamSep *)local_6e8,(char (*) [5])0x17b426);
        StreamSep::~StreamSep((StreamSep *)local_6e8);
        std::__cxx11::string::append((char *)&ss->beg);
      }
      StreamSepMaker::operator<<((StreamSep *)local_6e8,ss,(char (*) [19])"for( size_t n = ( ");
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_6e8._0_8_,(char *)local_6e8._8_8_,
                          local_6d8[0]._M_allocated_capacity);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,(this->var)._M_dataplus._M_p,(this->var)._M_string_length);
      local_678._M_dataplus._M_p = " )";
      if (this->beg != false) {
        local_678._M_dataplus._M_p = " ) - 1";
      }
      pSVar8 = StreamSep::operator<<((StreamSep *)local_6e8,(char **)&local_678);
      StreamSep::operator<<(pSVar8,(char (*) [16])"; n--; ++data )");
      StreamSep::~StreamSep((StreamSep *)local_6e8);
      StreamSepMaker::operator<<((StreamSep *)local_6e8,ss,(char (*) [19])"    if ( *data == ");
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_6e8._0_8_,(char *)local_6e8._8_8_,
                          local_6d8[0]._M_allocated_capacity);
      std::ostream::operator<<((ostream *)poVar6,cpp_emitter->stop_char);
      StreamSep::operator<<((StreamSep *)local_6e8,(char (*) [3])0x17d4a1);
      StreamSep::~StreamSep((StreamSep *)local_6e8);
      StreamSepMaker::operator<<((StreamSep *)local_6e8,ss,(char (*) [16])0x17bf94);
      iVar3 = Instruction::get_id_gen
                        ((this->super_Instruction).next.
                         super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         _M_impl.super__Vector_impl_data._M_start[1].inst,cpp_emitter);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_6e8._0_8_,(char *)local_6e8._8_8_,
                          local_6d8[0]._M_allocated_capacity);
      std::ostream::operator<<((ostream *)poVar6,iVar3);
      StreamSep::operator<<((StreamSep *)local_6e8,(char (*) [2])0x17b5e3);
      StreamSep::~StreamSep((StreamSep *)local_6e8);
      StreamSepMaker::operator<<((StreamSep *)local_6e8,ss,(char (*) [15])0x17c2e1);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_6e8._0_8_,(char *)local_6e8._8_8_,
                          local_6d8[0]._M_allocated_capacity);
      std::ostream::operator<<((ostream *)poVar6,cpp_emitter->stop_char);
      StreamSep::operator<<((StreamSep *)local_6e8,(char (*) [3])0x17d4a1);
      StreamSep::~StreamSep((StreamSep *)local_6e8);
      StreamSepMaker::operator<<((StreamSep *)local_6e8,ss,(char (*) [12])0x17bf98);
      iVar3 = Instruction::get_id_gen
                        ((this->super_Instruction).next.
                         super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         _M_impl.super__Vector_impl_data._M_start[1].inst,cpp_emitter);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_6e8._0_8_,(char *)local_6e8._8_8_,
                          local_6d8[0]._M_allocated_capacity);
      std::ostream::operator<<((ostream *)poVar6,iVar3);
      StreamSep::operator<<((StreamSep *)local_6e8,(char (*) [2])0x17b5e3);
      StreamSep::~StreamSep((StreamSep *)local_6e8);
      if (this->beg != true) goto LAB_0015571b;
      std::__cxx11::string::resize((ulong)&ss->beg,(char)(ss->beg)._M_string_length + -4);
      __return_storage_ptr__ = &local_108;
      StreamSepMaker::operator<<(__return_storage_ptr__,ss,(char (*) [2])0x17c0fa);
    }
    else {
      if (1 < (ulong)(((long)(this->super_Instruction).next.
                             super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                             super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->super_Instruction).next.
                             super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                             super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333))
      {
        StreamSepMaker::operator<<((StreamSep *)local_6e8,ss,(char (*) [15])"if ( data + ( ");
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_6e8._0_8_,(char *)local_6e8._8_8_,
                            local_6d8[0]._M_allocated_capacity);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,(this->var)._M_dataplus._M_p,(this->var)._M_string_length);
        local_678._M_dataplus._M_p = " )";
        if (this->beg != false) {
          local_678._M_dataplus._M_p = " ) - 1";
        }
        pSVar8 = StreamSep::operator<<((StreamSep *)local_6e8,(char **)&local_678);
        pSVar8 = StreamSep::operator<<(pSVar8,(char (*) [20])" > end_m1 ) goto l_");
        iVar3 = Instruction::get_id_gen
                          ((this->super_Instruction).next.
                           super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                           super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>
                           ._M_impl.super__Vector_impl_data._M_start[1].inst,cpp_emitter);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (pSVar8->stream,(pSVar8->sep)._M_dataplus._M_p,
                            (pSVar8->sep)._M_string_length);
        std::ostream::operator<<((ostream *)poVar6,iVar3);
        StreamSep::operator<<(pSVar8,(char (*) [2])0x17b5e3);
        StreamSep::~StreamSep((StreamSep *)local_6e8);
      }
      StreamSepMaker::operator<<((StreamSep *)local_6e8,ss,(char (*) [11])"data += ( ");
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_6e8._0_8_,(char *)local_6e8._8_8_,
                          local_6d8[0]._M_allocated_capacity);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,(this->var)._M_dataplus._M_p,(this->var)._M_string_length);
      local_678._M_dataplus._M_p = " )";
      if (this->beg != false) {
        local_678._M_dataplus._M_p = " ) - 1";
      }
      pSVar8 = StreamSep::operator<<((StreamSep *)local_6e8,(char **)&local_678);
      StreamSep::operator<<(pSVar8,(char (*) [2])0x17b5e3);
    }
    StreamSep::~StreamSep(__return_storage_ptr__);
    goto LAB_0015571b;
  }
  local_69c = cpp_emitter->nb_cont_label + 1;
  cpp_emitter->nb_cont_label = local_69c;
  local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
  pcVar1 = (this->var)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_678,pcVar1,pcVar1 + (this->var)._M_string_length);
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::CharGraph::Variable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::CharGraph::Variable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::CharGraph::Variable>_>_>
          ::find(&(cpp_emitter->variables)._M_t,&local_678);
  if ((_Rb_tree_header *)cVar5._M_node !=
      &(cpp_emitter->variables)._M_t._M_impl.super__Rb_tree_header) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6e8,
                   "HPIPE_DATA.",&local_678);
    std::__cxx11::string::operator=((string *)&local_678,(string *)local_6e8);
    if ((ostream *)local_6e8._0_8_ != (ostream *)(local_6e8 + 0x10)) {
      operator_delete((void *)local_6e8._0_8_,local_6d8[0]._M_allocated_capacity + 1);
    }
  }
  if (this->beg == true) {
    StreamSepMaker::operator<<((StreamSep *)local_6e8,ss,(char (*) [6])"if ( ");
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_6e8._0_8_,(char *)local_6e8._8_8_,
                        local_6d8[0]._M_allocated_capacity);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,local_678._M_dataplus._M_p,local_678._M_string_length);
    StreamSep::operator<<((StreamSep *)local_6e8,(char (*) [5])0x17b426);
    StreamSep::~StreamSep((StreamSep *)local_6e8);
    std::__cxx11::string::append((char *)&ss->beg);
    StreamSepMaker::operator<<((StreamSep *)local_6e8,ss,(char (*) [14])"size_t __l = ");
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_6e8._0_8_,(char *)local_6e8._8_8_,
                        local_6d8[0]._M_allocated_capacity);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,local_678._M_dataplus._M_p,local_678._M_string_length);
    StreamSep::operator<<((StreamSep *)local_6e8,(char (*) [6])0x17c2ad);
    StreamSep::~StreamSep((StreamSep *)local_6e8);
    std::__cxx11::string::_M_replace
              ((ulong)&local_678,0,(char *)local_678._M_string_length,0x17be62);
  }
  StreamSepMaker::operator<<((StreamSep *)local_6e8,ss,(char (*) [13])"if ( data + ");
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_6e8._0_8_,(char *)local_6e8._8_8_,
                      local_6d8[0]._M_allocated_capacity);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,local_678._M_dataplus._M_p,local_678._M_string_length);
  StreamSep::operator<<((StreamSep *)local_6e8,(char (*) [15])" <= end_m1 ) {");
  StreamSep::~StreamSep((StreamSep *)local_6e8);
  StreamSepMaker::operator<<((StreamSep *)local_6e8,ss,(char (*) [13])"    data += ");
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_6e8._0_8_,(char *)local_6e8._8_8_,
                      local_6d8[0]._M_allocated_capacity);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,local_678._M_dataplus._M_p,local_678._M_string_length);
  StreamSep::operator<<((StreamSep *)local_6e8,(char (*) [2])0x17b5e3);
  StreamSep::~StreamSep((StreamSep *)local_6e8);
  StreamSepMaker::operator<<(&local_150,ss,(char (*) [9])"} else {");
  StreamSep::~StreamSep(&local_150);
  Vec<std::__cxx11::string>::push_back_unique<char_const(&)[73]>
            ((Vec<std::__cxx11::string> *)&cpp_emitter->preliminaries,
             (char (*) [73])
             "#ifndef HPIPE_SIZE_T\n#define HPIPE_SIZE_T size_t\n#endif // HPIPE_SIZE_T\n");
  poVar6 = (ostream *)(local_6e8 + 0x10);
  local_6e8._0_8_ = poVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"__bytes_to_skip","");
  local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,"HPIPE_SIZE_T","");
  local_658._M_string_length = 0;
  local_658.field_2._M_allocated_capacity =
       local_658.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
  CppEmitter::add_variable(cpp_emitter,(string *)local_6e8,&local_698,&local_658);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != &local_658.field_2) {
    operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
  }
  if ((ostream *)local_6e8._0_8_ != poVar6) {
    operator_delete((void *)local_6e8._0_8_,local_6d8[0]._M_allocated_capacity + 1);
  }
  if ((this->beg == true) &&
     (1 < (ulong)(((long)(this->super_Instruction).next.
                         super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->super_Instruction).next.
                         super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333))) {
    StreamSepMaker::operator<<((StreamSep *)local_6e8,es,(char (*) [21])"if ( ! buf ) goto l_");
    iVar3 = Instruction::get_id_gen
                      ((this->super_Instruction).next.
                       super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                       super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                       _M_impl.super__Vector_impl_data._M_start[1].inst,cpp_emitter);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_6e8._0_8_,(char *)local_6e8._8_8_,
                        local_6d8[0]._M_allocated_capacity);
    std::ostream::operator<<((ostream *)poVar7,iVar3);
    StreamSep::operator<<((StreamSep *)local_6e8,(char (*) [2])0x17b5e3);
    StreamSep::~StreamSep((StreamSep *)local_6e8);
  }
  StreamSepMaker::operator<<
            ((StreamSep *)local_6e8,ss,(char (*) [34])"    HPIPE_DATA.__bytes_to_skip = ");
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_6e8._0_8_,(char *)local_6e8._8_8_,
                      local_6d8[0]._M_allocated_capacity);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,local_678._M_dataplus._M_p,local_678._M_string_length);
  StreamSep::operator<<
            ((StreamSep *)local_6e8,(char (*) [37])" - ( buf->data + buf->used - data );");
  StreamSep::~StreamSep((StreamSep *)local_6e8);
  StreamSepMaker::operator<<((StreamSep *)local_6e8,ss,(char (*) [5])"  t_");
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_6e8._0_8_,(char *)local_6e8._8_8_,
                      local_6d8[0]._M_allocated_capacity);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  StreamSep::operator<<((StreamSep *)local_6e8,(char (*) [2])0x17b6f7);
  StreamSep::~StreamSep((StreamSep *)local_6e8);
  StreamSepMaker::operator<<(&local_198,ss,(char (*) [25])"    if ( ! buf->next ) {");
  StreamSep::~StreamSep(&local_198);
  bVar2 = CppEmitter::interruptible(cpp_emitter);
  if (bVar2) {
    StreamSepMaker::operator<<(&local_1e0,ss,(char (*) [24])"        if ( last_buf )");
    StreamSep::~StreamSep(&local_1e0);
    StreamSepMaker::operator<<((StreamSep *)local_6e8,ss,(char (*) [20])"            goto l_");
    iVar3 = Instruction::get_id_gen
                      ((this->super_Instruction).next.
                       super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                       super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                       _M_impl.super__Vector_impl_data._M_start[1].inst,cpp_emitter);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_6e8._0_8_,(char *)local_6e8._8_8_,
                        local_6d8[0]._M_allocated_capacity);
    std::ostream::operator<<((ostream *)poVar7,iVar3);
    StreamSep::operator<<((StreamSep *)local_6e8,(char (*) [2])0x17b5e3);
    StreamSep::~StreamSep((StreamSep *)local_6e8);
    uVar4 = Instruction::need_buf_next(&this->super_Instruction);
    if (uVar4 == 0) {
      StreamSepMaker::operator<<
                ((StreamSep *)local_6e8,ss,(char (*) [35])"        HPIPE_DATA.inp_cont = &&c_");
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_6e8._0_8_,(char *)local_6e8._8_8_,
                          local_6d8[0]._M_allocated_capacity);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      StreamSep::operator<<((StreamSep *)local_6e8,(char (*) [2])0x17b5e3);
    }
    else {
      local_6e8._0_8_ = poVar6;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"pending_buf","");
      local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,"HPIPE_BUFF_T *","");
      local_658._M_string_length = 0;
      local_658.field_2._M_allocated_capacity =
           local_658.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
      CppEmitter::add_variable(cpp_emitter,(string *)local_6e8,&local_698,&local_658);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_658._M_dataplus._M_p != &local_658.field_2) {
        operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_698._M_dataplus._M_p != &local_698.field_2) {
        operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
      }
      if ((ostream *)local_6e8._0_8_ != poVar6) {
        operator_delete((void *)local_6e8._0_8_,local_6d8[0]._M_allocated_capacity + 1);
      }
      StreamSepMaker::operator<<
                (&local_228,ss,(char (*) [38])"        HPIPE_DATA.pending_buf = buf;");
      StreamSep::~StreamSep(&local_228);
      if (cpp_emitter->buffer_type == 1) {
        uVar4 = Instruction::need_buf_next(&this->super_Instruction);
        if (uVar4 == 1) {
          StreamSepMaker::operator<<
                    (&local_270,ss,(char (*) [38])"        HPIPE_BUFF_T__INC_REF( buf );");
          pSVar8 = &local_270;
        }
        else {
          StreamSepMaker::operator<<
                    ((StreamSep *)local_6e8,ss,
                     (char (*) [39])"        HPIPE_BUFF_T__INC_REF_N( buf, ");
          Instruction::need_buf_next(&this->super_Instruction);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_6e8._0_8_,(char *)local_6e8._8_8_,
                              local_6d8[0]._M_allocated_capacity);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          StreamSep::operator<<((StreamSep *)local_6e8,(char (*) [4])0x17b5e1);
        }
        StreamSep::~StreamSep(pSVar8);
      }
      StreamSepMaker::operator<<
                ((StreamSep *)local_6e8,ss,(char (*) [35])"        HPIPE_DATA.inp_cont = &&e_");
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_6e8._0_8_,(char *)local_6e8._8_8_,
                          local_6d8[0]._M_allocated_capacity);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      StreamSep::operator<<((StreamSep *)local_6e8,(char (*) [2])0x17b5e3);
    }
    StreamSep::~StreamSep((StreamSep *)local_6e8);
    StreamSepMaker::operator<<(&local_2b8,ss,(char (*) [25])"        return RET_CONT;");
    StreamSep::~StreamSep(&local_2b8);
    uVar4 = Instruction::need_buf_next(&this->super_Instruction);
    if (uVar4 != 0) {
      StreamSepMaker::operator<<((StreamSep *)local_6e8,ss,(char (*) [9])"      e_");
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_6e8._0_8_,(char *)local_6e8._8_8_,
                          local_6d8[0]._M_allocated_capacity);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      pSVar8 = StreamSep::operator<<((StreamSep *)local_6e8,(char (*) [2])0x17b6f7);
      bVar2 = cpp_emitter->trace_labels;
      if (bVar2 == true) {
        to_string<unsigned_int>(&local_638,&local_69c);
        plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_638,0,(char *)0x0,0x17c08b);
        local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
        puVar10 = (ulong *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar10) {
          local_658.field_2._M_allocated_capacity = *puVar10;
          local_658.field_2._8_8_ = plVar9[3];
        }
        else {
          local_658.field_2._M_allocated_capacity = *puVar10;
          local_658._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_658._M_string_length = plVar9[1];
        *plVar9 = (long)puVar10;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_658);
        local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
        psVar11 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_698.field_2._M_allocated_capacity = *psVar11;
          local_698.field_2._8_8_ = plVar9[3];
        }
        else {
          local_698.field_2._M_allocated_capacity = *psVar11;
          local_698._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_698._M_string_length = plVar9[1];
        *plVar9 = (long)psVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
      }
      else {
        local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,"");
      }
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (pSVar8->stream,(pSVar8->sep)._M_dataplus._M_p,
                          (pSVar8->sep)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,local_698._M_dataplus._M_p,local_698._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_698._M_dataplus._M_p != &local_698.field_2) {
        operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
      }
      if (bVar2 != false) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_658._M_dataplus._M_p != &local_658.field_2) {
          operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_638._M_dataplus._M_p != &local_638.field_2) {
          operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
        }
      }
      StreamSep::~StreamSep((StreamSep *)local_6e8);
      StreamSepMaker::operator<<
                (&local_300,ss,(char (*) [44])"        HPIPE_DATA.pending_buf->next = buf;");
      StreamSep::~StreamSep(&local_300);
      StreamSepMaker::operator<<
                (&local_348,ss,(char (*) [38])"        HPIPE_DATA.pending_buf = buf;");
      StreamSep::~StreamSep(&local_348);
      StreamSepMaker::operator<<((StreamSep *)local_6e8,ss,(char (*) [16])"        goto c_");
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_6e8._0_8_,(char *)local_6e8._8_8_,
                          local_6d8[0]._M_allocated_capacity);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      StreamSep::operator<<((StreamSep *)local_6e8,(char (*) [2])0x17b5e3);
      goto LAB_00155426;
    }
  }
  else {
    StreamSepMaker::operator<<((StreamSep *)local_6e8,ss,(char (*) [16])0x17bf94);
    iVar3 = Instruction::get_id_gen
                      ((this->super_Instruction).next.
                       super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                       super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                       _M_impl.super__Vector_impl_data._M_start[1].inst,cpp_emitter);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_6e8._0_8_,(char *)local_6e8._8_8_,
                        local_6d8[0]._M_allocated_capacity);
    std::ostream::operator<<((ostream *)poVar6,iVar3);
    StreamSep::operator<<((StreamSep *)local_6e8,(char (*) [2])0x17b5e3);
LAB_00155426:
    StreamSep::~StreamSep((StreamSep *)local_6e8);
  }
  StreamSepMaker::operator<<(&local_390,ss,(char (*) [6])"    }");
  StreamSep::~StreamSep(&local_390);
  if (cpp_emitter->buffer_type == 0) {
    StreamSepMaker::operator<<
              (&local_3d8,ss,(char (*) [39])"    end -= buf->used; buf = buf->next;");
    this_00 = &local_3d8;
  }
  else {
    uVar4 = Instruction::need_buf_next(&this->super_Instruction);
    if (uVar4 < 2) {
      uVar4 = Instruction::need_buf_next(&this->super_Instruction);
      if (uVar4 == 1) {
        StreamSepMaker::operator<<(&local_420,ss,(char (*) [21])"    buf = buf->next;");
        this_00 = &local_420;
      }
      else {
        StreamSepMaker::operator<<
                  (&local_468,ss,
                   (char (*) [76])
                   "    HPIPE_BUFF_T *old = buf; buf = buf->next; HPIPE_BUFF_T__DEC_REF( old );");
        this_00 = &local_468;
      }
    }
    else {
      StreamSepMaker::operator<<((StreamSep *)local_6e8,ss,(char (*) [35])0x17c000);
      Instruction::need_buf_next(&this->super_Instruction);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_6e8._0_8_,(char *)local_6e8._8_8_,
                          local_6d8[0]._M_allocated_capacity);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      StreamSep::operator<<((StreamSep *)local_6e8,(char (*) [21])" ); buf = buf->next;");
    }
  }
  StreamSep::~StreamSep(this_00);
  StreamSepMaker::operator<<((StreamSep *)local_6e8,ss,(char (*) [5])"  c_");
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_6e8._0_8_,(char *)local_6e8._8_8_,
                      local_6d8[0]._M_allocated_capacity);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  StreamSep::operator<<((StreamSep *)local_6e8,(char (*) [2])0x17b6f7);
  StreamSep::~StreamSep((StreamSep *)local_6e8);
  StreamSepMaker::operator<<
            (&local_4b0,ss,(char (*) [53])"    if ( HPIPE_DATA.__bytes_to_skip >= buf->used ) {");
  StreamSep::~StreamSep(&local_4b0);
  StreamSepMaker::operator<<
            (&local_4f8,ss,(char (*) [49])"        HPIPE_DATA.__bytes_to_skip -= buf->used;");
  StreamSep::~StreamSep(&local_4f8);
  StreamSepMaker::operator<<((StreamSep *)local_6e8,ss,(char (*) [16])"        goto t_");
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_6e8._0_8_,(char *)local_6e8._8_8_,
                      local_6d8[0]._M_allocated_capacity);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  StreamSep::operator<<((StreamSep *)local_6e8,(char (*) [2])0x17b5e3);
  StreamSep::~StreamSep((StreamSep *)local_6e8);
  StreamSepMaker::operator<<(&local_540,ss,(char (*) [6])"    }");
  StreamSep::~StreamSep(&local_540);
  StreamSepMaker::operator<<
            (&local_588,ss,(char (*) [51])"    data = buf->data + HPIPE_DATA.__bytes_to_skip;");
  StreamSep::~StreamSep(&local_588);
  bVar2 = CppEmitter::interruptible(cpp_emitter);
  if (bVar2) {
    pSVar8 = &local_78;
    StreamSepMaker::operator<<(pSVar8,ss,(char (*) [40])"    end_m1 = buf->data + buf->used - 1;");
  }
  else {
    pSVar8 = &local_c0;
    StreamSepMaker::operator<<
              (pSVar8,ss,
               (char (*) [68])"    end_m1 = buf->data + ( end > buf->used ? buf->used : end ) - 1;")
    ;
  }
  StreamSep::~StreamSep(pSVar8);
  StreamSepMaker::operator<<(&local_5d0,ss,(char (*) [2])0x17c0fa);
  StreamSep::~StreamSep(&local_5d0);
  if (this->beg == true) {
    std::__cxx11::string::resize((ulong)&ss->beg,(char)(ss->beg)._M_string_length + -4);
    StreamSepMaker::operator<<(&local_618,ss,(char (*) [2])0x17c0fa);
    StreamSep::~StreamSep(&local_618);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._M_dataplus._M_p != &local_678.field_2) {
    operator_delete(local_678._M_dataplus._M_p,local_678.field_2._M_allocated_capacity + 1);
  }
LAB_0015571b:
  Instruction::write_trans(&this->super_Instruction,ss,cpp_emitter,0);
  return;
}

Assistant:

void InstructionSkipBytes::write_cpp( StreamSepMaker &ss, StreamSepMaker &es, CppEmitter *cpp_emitter ) {
    if ( cpp_emitter->need_buf() ) {
        unsigned cont_label = ++cpp_emitter->nb_cont_label;

        // cpp_emitter->need_loc_var(  );
        std::string v = var;
        if ( cpp_emitter->variables.count( v ) )
            v = "HPIPE_DATA." + v;
        if ( beg ) {
            ss << "if ( " << v << " ) {";
            ss.beg += "    ";
            ss << "size_t __l = " << v << " - 1;";
            v = "__l";
        }
        // we can stay in the same buffer
        ss << "if ( data + " << v << " <= end_m1 ) {";
        ss << "    data += " << v << ";";
        ss << "} else {";
        // skip data in current buf
        cpp_emitter->preliminaries.push_back_unique( "#ifndef HPIPE_SIZE_T\n#define HPIPE_SIZE_T size_t\n#endif // HPIPE_SIZE_T\n" );
        cpp_emitter->add_variable( "__bytes_to_skip", "HPIPE_SIZE_T" );
        if ( beg && next.size() >= 2 )
            es << "if ( ! buf ) goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
        ss << "    HPIPE_DATA.__bytes_to_skip = " << v << " - ( buf->data + buf->used - data );";
        ss << "  t_" << cont_label << ":";
        ss << "    if ( ! buf->next ) {";
        if ( cpp_emitter->interruptible() ) {
            ss << "        if ( last_buf )";
            ss << "            goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
            if ( need_buf_next() ) {
                cpp_emitter->add_variable( "pending_buf", "HPIPE_BUFF_T *" );
                ss << "        HPIPE_DATA.pending_buf = buf;";
                if ( cpp_emitter->buffer_type == CppEmitter::BT_HPIPE_BUFFER ) {
                    if ( need_buf_next() == 1 )
                        ss << "        HPIPE_BUFF_T__INC_REF( buf );";
                    else
                        ss << "        HPIPE_BUFF_T__INC_REF_N( buf, " << need_buf_next() << " );";
                }
                ss << "        HPIPE_DATA.inp_cont = &&e_" << cont_label << ";";
            } else
                ss << "        HPIPE_DATA.inp_cont = &&c_" << cont_label << ";";
            ss << "        return RET_CONT;";
            if ( need_buf_next() ) {
                // e_... (come back code)
                ss << "      e_" << cont_label << ":" << ( cpp_emitter->trace_labels ? " std::cout << \"e_" + to_string( cont_label ) + " \" << __LINE__ << std::endl;" : "" );
                ss << "        HPIPE_DATA.pending_buf->next = buf;";
                ss << "        HPIPE_DATA.pending_buf = buf;";
                ss << "        goto c_" << cont_label << ";";
            }
        } else
            ss << "        goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
        ss << "    }";
        if ( cpp_emitter->buffer_type == CppEmitter::BT_HPIPE_CB_STRING_PTR )
            ss << "    end -= buf->used; buf = buf->next;";
        else if ( need_buf_next() > 1 )
            ss << "    HPIPE_BUFF_T__INC_REF_N( buf, " << need_buf_next() - 1 << " ); buf = buf->next;";
        else if ( need_buf_next() == 1 )
            ss << "    buf = buf->next;";
        else
            ss << "    HPIPE_BUFF_T *old = buf; buf = buf->next; HPIPE_BUFF_T__DEC_REF( old );";
        ss << "  c_" << cont_label << ":";
        ss << "    if ( HPIPE_DATA.__bytes_to_skip >= buf->used ) {";
        ss << "        HPIPE_DATA.__bytes_to_skip -= buf->used;";
        ss << "        goto t_" << cont_label << ";";
        ss << "    }";
        ss << "    data = buf->data + HPIPE_DATA.__bytes_to_skip;";
        if ( cpp_emitter->interruptible() )
            ss << "    end_m1 = buf->data + buf->used - 1;";
        else
            ss << "    end_m1 = buf->data + ( end > buf->used ? buf->used : end ) - 1;";
        ss << "}";
        if ( beg ) {
            ss.beg.resize( ss.beg.size() - 4 );
            ss << "}";
        }
    } else if ( cpp_emitter->buffer_type == CppEmitter::BT_C_STR ) {
        if ( beg ) {
            ss << "if ( " << var << " ) {";
            ss.beg += "    ";
        }
        ss << "for( size_t n = ( " << var << ( beg ? " ) - 1" : " )" ) << "; n--; ++data )";
        ss << "    if ( *data == " << cpp_emitter->stop_char << " )";
        ss << "        goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
        ss << "if ( *data == " << cpp_emitter->stop_char << " )";
        ss << "    goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
        if ( beg ) {
            ss.beg.resize( ss.beg.size() - 4 );
            ss << "}";
        }
    } else {
        if ( next.size() > 1 )
            ss << "if ( data + ( " << var << ( beg ? " ) - 1" : " )" ) << " > end_m1 ) goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
        ss << "data += ( " << var << ( beg ? " ) - 1" : " )" ) << ";";
    }
    write_trans( ss, cpp_emitter );
}